

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

void la_adsc_intermediate_projection_format_json
               (la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  la_vstring *in_RDX;
  la_adsc_intermediate_projection_t *p;
  char *in_stack_ffffffffffffffd8;
  
  la_json_append_double(in_RDX,in_stack_ffffffffffffffd8,7.54439229330875e-318);
  la_json_append_double(in_RDX,in_stack_ffffffffffffffd8,7.5445405130025e-318);
  la_json_append_bool(in_RDX,in_stack_ffffffffffffffd8,false);
  la_json_append_int64(in_RDX,in_stack_ffffffffffffffd8,0x174d4b);
  la_json_append_int64(in_RDX,in_stack_ffffffffffffffd8,0x174d68);
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_intermediate_projection_format_json) {
	LA_UNUSED(label);
	la_adsc_intermediate_projection_t const *p = data;
	la_json_append_double(ctx->vstr, "dist_nm", p->distance);
	la_json_append_double(ctx->vstr, "true_trk_deg", p->track);
	la_json_append_bool(ctx->vstr, "true_trk_valid", p->track_invalid ? false : true);
	la_json_append_int64(ctx->vstr, "alt", p->alt);
	la_json_append_int64(ctx->vstr, "eta_sec", p->eta);
}